

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O1

bool __thiscall
iDynTree::SensorsList::getSensorIndex
          (SensorsList *this,SensorType *sensor_type,string *_sensor_name,ptrdiff_t *sensor_index)

{
  iterator iVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          ::find(&(this->pimpl->sensorsNameToIndex).
                  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[*sensor_type]._M_t,_sensor_name);
  p_Var3 = &(this->pimpl->sensorsNameToIndex).
            super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[*sensor_type]._M_t._M_impl.
            super__Rb_tree_header._M_header;
  if (iVar1._M_node == p_Var3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[ERROR] getSensorIndex did not find sensor ",0x2b);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(_sensor_name->_M_dataplus)._M_p,
                        _sensor_name->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  else {
    *sensor_index = *(ptrdiff_t *)(iVar1._M_node + 2);
  }
  return iVar1._M_node != p_Var3;
}

Assistant:

bool SensorsList::getSensorIndex(const SensorType & sensor_type, const std::string & _sensor_name, std::ptrdiff_t & sensor_index) const
{
    SensorsListPimpl::SensorNameToIndexMap::const_iterator it;
    it = this->pimpl->sensorsNameToIndex[sensor_type].find(_sensor_name);
    if( it == this->pimpl->sensorsNameToIndex[sensor_type].end() )
    {
        std::cerr << "[ERROR] getSensorIndex did not find sensor " << _sensor_name << std::endl;
        return false;
    }
    else
    {
        sensor_index = it->second;
        return true;
    }
}